

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O2

void __thiscall spatial_region::birth_from_vacuum(spatial_region *this,double q)

{
  particle *ppVar1;
  undefined1 auVar2 [16];
  function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *this_00;
  particle *__args;
  particle *__args_00;
  cellp *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int k;
  long lVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined8 in_XMM0_Qb;
  vector3d position;
  vector3d direction;
  double a;
  vector3d local_f8;
  function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  vector3d local_c0;
  vector3d b;
  vector3d e;
  double local_58;
  vector3d local_48;
  
  if (qed_enabled) {
    b.x = 0.0;
    b.y = 0.0;
    b.z = 0.0;
    e.z = 0.0;
    e.x = 0.0;
    e.y = 0.0;
    local_48.x = 1.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    a = this->dt * -0.5;
    auVar2._8_8_ = in_XMM0_Qb;
    auVar2._0_8_ = q;
    local_e0 = &this->advance_momentum;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar2,auVar8);
    for (lVar6 = 2; lVar6 < (long)this->nx + -2; lVar6 = lVar6 + 1) {
      local_d8 = (double)(int)lVar6 + 0.5;
      for (lVar5 = 2; lVar5 < (long)this->ny + -2; lVar5 = lVar5 + 1) {
        local_d0 = (double)(int)lVar5 + 0.5;
        lVar4 = 0x20;
        lVar7 = 2;
        while( true ) {
          if ((long)this->nz + -2 <= lVar7) break;
          local_f8.x = local_d8;
          local_f8.y = local_d0;
          local_f8.z = (double)(int)lVar7 + 0.5;
          e_to_particle(&local_c0,this,&local_f8.x,&local_f8.y,&local_f8.z);
          e.z = local_c0.z;
          e.x = local_c0.x;
          e.y = local_c0.y;
          b_to_particle(&local_c0,this,&local_f8.x,&local_f8.y,&local_f8.z);
          b.z = local_c0.z;
          b.x = local_c0.x;
          b.y = local_c0.y;
          local_c8 = get_rand(this);
          dVar9 = mathcal_W(this,&e,&b);
          if (local_c8 < dVar9 * this->dt * this->dx * this->dy * this->dz) {
            local_58 = auVar8._0_8_;
            __args = bear_particle(this,-1.0,&local_f8,&local_48,1.0,0.0,local_58);
            this_00 = local_e0;
            std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::operator()
                      (local_e0,__args,&e,&b,&a);
            __args_00 = bear_particle(this,1.0,&local_f8,&local_48,1.0,0.0,q);
            std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::operator()
                      (this_00,__args_00,&e,&b,&a);
            __args->next = __args_00;
            __args_00->previous = __args;
            pcVar3 = (this->cp).p._M_t.
                     super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                     super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar6][lVar5];
            ppVar1 = *(particle **)((long)&(pcVar3->pl).head + lVar4);
            if (ppVar1 == (particle *)0x0) {
              pcVar3 = pcVar3 + lVar7;
            }
            else {
              __args_00->next = ppVar1;
              *(particle **)
               (*(long *)((long)&((this->cp).p._M_t.
                                  super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                  .super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar6]
                                  [lVar5]->pl).head + lVar4) + 0x60) = __args_00;
              pcVar3 = (cellp *)((long)&((this->cp).p._M_t.
                                         super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                         .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                         [lVar6][lVar5]->pl).head + lVar4);
            }
            (pcVar3->pl).head = __args;
            pcVar3 = (this->cp).p._M_t.
                     super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                     super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar6][lVar5];
            *(undefined8 *)((long)&(pcVar3->pl).start + lVar4) =
                 *(undefined8 *)((long)&(pcVar3->pl).head + lVar4);
          }
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + 0x10;
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::birth_from_vacuum(double q)
{
    if (!qed_enabled)
        return;
    #ifndef QUILL_NOQED
    vector3d e,b;
    vector3d position;
    vector3d direction;
    direction.x = 1;
    direction.y = 0;
    direction.z = 0;
    double a = -dt/2;
    particle* p1;
    particle* p2;
    // границы взяты из ndfx для поля e
    for(int i=2;i<nx-2;i++)
    {
        for(int j=2;j<ny-2;j++)
        {
            for(int k=2;k<nz-2;k++)
            {
                /* 0.5 - чтобы избежать пересечений, вызванных очень
                 * незначительными смещениями */
                position.x = i + 0.5;
                position.y = j + 0.5;
                position.z = k + 0.5;
                e = e_to_particle(position.x,position.y,position.z);
                b = b_to_particle(position.x,position.y,position.z);
                if (get_rand()<mathcal_W(e,b)*dt*dx*dy*dz)
                {
                    /* начальное направление движения безразлично при
                     * g = 1 */
                    p1 = bear_particle(-1,position,direction,1,0,-q);
                    advance_momentum(*p1, e, b, a);
                    p2 = bear_particle(1,position,direction,1,0,q);
                    advance_momentum(*p2, e, b, a);
                    p1->next = p2;
                    p2->previous = p1;
                    if (cp[i][j][k].pl.head==0)
                    {
                        cp[i][j][k].pl.head = p1;
                    }
                    else
                    {
                        p2->next = cp[i][j][k].pl.head;
                        cp[i][j][k].pl.head->previous = p2;
                        cp[i][j][k].pl.head = p1;
                    }
                    cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                }
            }
        }
    }
    #endif
}